

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Scene * book_cover(void)

{
  double dVar1;
  double dVar2;
  Point3 look_from;
  Point3 look_at;
  Vec3 vup;
  Scene *in_RDI;
  Vec3 local_460;
  double local_448;
  double dStack_440;
  double local_438;
  double local_428;
  double dStack_420;
  double local_418;
  undefined1 local_410 [8];
  Camera camera;
  double focal_dist;
  double aperture;
  double field_of_view;
  Point3 camera_target;
  Point3 camera_position;
  Vec3 local_310;
  undefined1 local_2f8 [32];
  undefined8 local_2d8;
  Vec3 local_2d0;
  undefined1 local_2b8 [8];
  shared_ptr<Metal> material3;
  Vec3 local_2a0;
  undefined1 local_288 [32];
  Vec3 local_268;
  undefined1 local_250 [8];
  shared_ptr<Lambertian> material2;
  Vec3 local_238;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined1 local_1f8 [8];
  shared_ptr<Dielectric> material1;
  undefined1 local_1e0 [32];
  undefined8 local_1c0;
  undefined1 local_1b8 [8];
  shared_ptr<Dielectric> sphere_material_2;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  shared_ptr<Metal> sphere_material_1;
  double fuzz;
  Vec3 albedo_1;
  undefined1 local_148 [32];
  undefined1 local_128 [8];
  shared_ptr<Lambertian> sphere_material;
  Color albedo;
  Vec3 local_e8;
  undefined1 local_d0 [8];
  Point3 center;
  double choose_mat;
  int local_a8;
  int b;
  int a;
  undefined1 local_88 [48];
  Vec3 local_58;
  undefined1 local_40 [8];
  shared_ptr<Lambertian> ground_mat;
  ObjectList objects;
  
  ObjectList::ObjectList
            ((ObjectList *)
             &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Vec3::Vec3(&local_58,0.5,0.5,0.5);
  std::make_shared<Lambertian,Vec3>((Vec3 *)local_40);
  Vec3::Vec3((Vec3 *)&a,0.0,-1000.0,0.0);
  b = 1000;
  std::make_shared<Sphere,Vec3,int,std::shared_ptr<Lambertian>&>
            ((Vec3 *)local_88,&a,(shared_ptr<Lambertian> *)&b);
  std::shared_ptr<Object>::shared_ptr<Sphere,void>
            ((shared_ptr<Object> *)(local_88 + 0x10),(shared_ptr<Sphere> *)local_88);
  ObjectList::add((ObjectList *)
                  &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ,(shared_ptr<Object> *)(local_88 + 0x10));
  std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_88 + 0x10));
  std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_88);
  for (local_a8 = -0xb; local_a8 < 0xb; local_a8 = local_a8 + 1) {
    for (choose_mat._4_4_ = -0xb; choose_mat._4_4_ < 0xb; choose_mat._4_4_ = choose_mat._4_4_ + 1) {
      center.e[2] = nrand();
      dVar1 = nrand();
      dVar2 = nrand();
      Vec3::Vec3((Vec3 *)local_d0,dVar1 * 0.9 + (double)local_a8,0.2,
                 dVar2 * 0.9 + (double)choose_mat._4_4_);
      Vec3::Vec3((Vec3 *)(albedo.e + 2),4.0,0.2,0.0);
      operator-(&local_e8,(Vec3 *)local_d0,(Vec3 *)(albedo.e + 2));
      dVar1 = Vec3::length(&local_e8);
      if (2.0 < dVar1) {
        if (0.8 <= center.e[2]) {
          if (0.95 <= center.e[2]) {
            local_1c0 = 0x3ff8000000000000;
            std::make_shared<Dielectric,double>((double *)local_1b8);
            material1.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fc999999999999a;
            std::make_shared<Sphere,Vec3&,double,std::shared_ptr<Dielectric>&>
                      ((Vec3 *)local_1e0,(double *)local_d0,
                       (shared_ptr<Dielectric> *)
                       &material1.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::shared_ptr<Object>::shared_ptr<Sphere,void>
                      ((shared_ptr<Object> *)(local_1e0 + 0x10),(shared_ptr<Sphere> *)local_1e0);
            ObjectList::add((ObjectList *)
                            &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,(shared_ptr<Object> *)(local_1e0 + 0x10));
            std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_1e0 + 0x10));
            std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_1e0);
            std::shared_ptr<Dielectric>::~shared_ptr((shared_ptr<Dielectric> *)local_1b8);
          }
          else {
            Vec3::random();
            sphere_material_1.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)nrand(0.0,0.5);
            std::make_shared<Metal,Vec3&,double&>((Vec3 *)local_180,&fuzz);
            sphere_material_2.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fc999999999999a;
            std::make_shared<Sphere,Vec3&,double,std::shared_ptr<Metal>&>
                      ((Vec3 *)local_1a0,(double *)local_d0,
                       (shared_ptr<Metal> *)
                       &sphere_material_2.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::shared_ptr<Object>::shared_ptr<Sphere,void>
                      ((shared_ptr<Object> *)(local_1a0 + 0x10),(shared_ptr<Sphere> *)local_1a0);
            ObjectList::add((ObjectList *)
                            &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,(shared_ptr<Object> *)(local_1a0 + 0x10));
            std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_1a0 + 0x10));
            std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_1a0);
            std::shared_ptr<Metal>::~shared_ptr((shared_ptr<Metal> *)local_180);
          }
        }
        else {
          Vec3::random();
          std::make_shared<Lambertian,Vec3&>((Vec3 *)local_128);
          albedo_1.e[2] = 0.2;
          std::make_shared<Sphere,Vec3&,double,std::shared_ptr<Lambertian>&>
                    ((Vec3 *)local_148,(double *)local_d0,(shared_ptr<Lambertian> *)(albedo_1.e + 2)
                    );
          std::shared_ptr<Object>::shared_ptr<Sphere,void>
                    ((shared_ptr<Object> *)(local_148 + 0x10),(shared_ptr<Sphere> *)local_148);
          ObjectList::add((ObjectList *)
                          &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(shared_ptr<Object> *)(local_148 + 0x10));
          std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_148 + 0x10));
          std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_148);
          std::shared_ptr<Lambertian>::~shared_ptr((shared_ptr<Lambertian> *)local_128);
        }
      }
    }
  }
  local_200 = 0x3ff8000000000000;
  std::make_shared<Dielectric,double>((double *)local_1f8);
  Vec3::Vec3(&local_238,0.0,1.0,0.0);
  material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  std::make_shared<Sphere,Vec3,double,std::shared_ptr<Dielectric>&>
            ((Vec3 *)local_220,local_238.e,
             (shared_ptr<Dielectric> *)
             &material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Object>::shared_ptr<Sphere,void>
            ((shared_ptr<Object> *)(local_220 + 0x10),(shared_ptr<Sphere> *)local_220);
  ObjectList::add((ObjectList *)
                  &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ,(shared_ptr<Object> *)(local_220 + 0x10));
  std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_220 + 0x10));
  std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_220);
  Vec3::Vec3(&local_268,0.4,0.2,0.1);
  std::make_shared<Lambertian,Vec3>((Vec3 *)local_250);
  Vec3::Vec3(&local_2a0,-4.0,1.0,0.0);
  material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  std::make_shared<Sphere,Vec3,double,std::shared_ptr<Lambertian>&>
            ((Vec3 *)local_288,local_2a0.e,
             (shared_ptr<Lambertian> *)
             &material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Object>::shared_ptr<Sphere,void>
            ((shared_ptr<Object> *)(local_288 + 0x10),(shared_ptr<Sphere> *)local_288);
  ObjectList::add((ObjectList *)
                  &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ,(shared_ptr<Object> *)(local_288 + 0x10));
  std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_288 + 0x10));
  std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_288);
  Vec3::Vec3(&local_2d0,0.7,0.6,0.5);
  local_2d8 = 0;
  std::make_shared<Metal,Vec3,double>((Vec3 *)local_2b8,local_2d0.e);
  Vec3::Vec3(&local_310,4.0,1.0,0.0);
  camera_position.e[2] = 1.0;
  std::make_shared<Sphere,Vec3,double,std::shared_ptr<Metal>&>
            ((Vec3 *)local_2f8,local_310.e,(shared_ptr<Metal> *)(camera_position.e + 2));
  std::shared_ptr<Object>::shared_ptr<Sphere,void>
            ((shared_ptr<Object> *)(local_2f8 + 0x10),(shared_ptr<Sphere> *)local_2f8);
  ObjectList::add((ObjectList *)
                  &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ,(shared_ptr<Object> *)(local_2f8 + 0x10));
  std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)(local_2f8 + 0x10));
  std::shared_ptr<Sphere>::~shared_ptr((shared_ptr<Sphere> *)local_2f8);
  Vec3::Vec3((Vec3 *)(camera_target.e + 2),10.0,2.0,-5.0);
  Vec3::Vec3((Vec3 *)&field_of_view,0.0,0.0,0.0);
  camera.lens_radius_ = 10.0;
  local_418 = camera_position.e[1];
  local_428 = camera_target.e[2];
  dStack_420 = camera_position.e[0];
  local_438 = camera_target.e[1];
  local_448 = field_of_view;
  dStack_440 = camera_target.e[0];
  Vec3::Vec3(&local_460,0.0,1.0,0.0);
  look_from.e[1] = dStack_420;
  look_from.e[0] = local_428;
  look_from.e[2] = local_418;
  look_at.e[1] = dStack_440;
  look_at.e[0] = local_448;
  look_at.e[2] = local_438;
  vup.e[1] = local_460.e[1];
  vup.e[0] = local_460.e[0];
  vup.e[2] = local_460.e[2];
  Camera::Camera((Camera *)local_410,look_from,look_at,vup,30.0,1.7777777777777777,0.1,10.0);
  ObjectList::ObjectList
            (&in_RDI->objects_,
             (ObjectList *)
             &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  memcpy(&in_RDI->camera_,local_410,0xb0);
  std::shared_ptr<Metal>::~shared_ptr((shared_ptr<Metal> *)local_2b8);
  std::shared_ptr<Lambertian>::~shared_ptr((shared_ptr<Lambertian> *)local_250);
  std::shared_ptr<Dielectric>::~shared_ptr((shared_ptr<Dielectric> *)local_1f8);
  std::shared_ptr<Lambertian>::~shared_ptr((shared_ptr<Lambertian> *)local_40);
  ObjectList::~ObjectList
            ((ObjectList *)
             &ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return in_RDI;
}

Assistant:

Scene book_cover() {

  ObjectList objects;

  auto ground_mat = std::make_shared<Lambertian>(Color(0.5, 0.5, 0.5));
  objects.add(std::make_shared<Sphere>(Point3(0, -1000, 0), 1000, ground_mat));

  for (int a = -11; a < 11; a++) {
    for (int b = -11; b < 11; b++) {
      auto choose_mat = nrand();
      Point3 center{a + 0.9*nrand(), 0.2, b + 0.9*nrand()};

      if ((center - Vec3(4, 0.2, 0)).length() > 2.0) {
        if (choose_mat < 0.8) {
          Color albedo = Color::random(0, 1);
          auto sphere_material = std::make_shared<Lambertian>(albedo);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        } else if (choose_mat < 0.95) {
          auto albedo = Color::random(0.5, 1);
          auto fuzz = nrand(0, 0.5);
          auto sphere_material = std::make_shared<Metal>(albedo, fuzz);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        } else {
          // glass
          auto sphere_material = std::make_shared<Dielectric>(1.5);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        }
      }
    }
  }

  auto material1 = std::make_shared<Dielectric>(1.5);
  objects.add(std::make_shared<Sphere>(Point3(0, 1, 0), 1.0, material1));

  auto material2 = std::make_shared<Lambertian>(Color(0.4, 0.2, 0.1));
  objects.add(std::make_shared<Sphere>(Point3(-4, 1, 0), 1.0, material2));

  auto material3 = std::make_shared<Metal>(Color(0.7, 0.6, 0.5), 0.0);
  objects.add(std::make_shared<Sphere>(Point3(4, 1, 0), 1.0, material3));

  // Setup camera
  Point3 camera_position{10, 2, -5};
  Point3 camera_target{0, 0, 0};
  double field_of_view = 30;
  double aperture = 0.1;
  double focal_dist = 10.0;

  Camera camera(camera_position,
                camera_target,
                Point3(0, 1, 0),
                field_of_view,
                ASPECT_RATIO,
                aperture,
                10.0);
  return {objects, camera};
}